

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  iterator iVar1;
  cmSourceFile *pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_bool>
  pVar3;
  value_type entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
  local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          ::find(&(this->NameMap)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->NameMap)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = cmMakefile::GetSourceFileWithOutput(this->Makefile,name);
    std::__cxx11::string::string((string *)&local_50,(string *)name);
    local_50.second = pcVar2;
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourceFile*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourceFile*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmSourceFile*>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourceFile*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourceFile*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
                        *)&this->NameMap,&local_50);
    iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_50.first._M_dataplus._M_p = *(pointer *)(iVar1._M_node + 2);
  if ((cmSourceFile *)local_50.first._M_dataplus._M_p != (cmSourceFile *)0x0) {
    if (this->CurrentEntry != (SourceEntry *)0x0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                (&this->CurrentEntry->Depends,(value_type *)&local_50);
    }
    QueueSource(this,(cmSourceFile *)local_50.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  NameMapType::iterator i = this->NameMap.find(name);
  if (i == this->NameMap.end()) {
    // Check if we know how to generate this file.
    cmSourceFile* sf = this->Makefile->GetSourceFileWithOutput(name);
    NameMapType::value_type entry(name, sf);
    i = this->NameMap.insert(entry).first;
  }
  if (cmSourceFile* sf = i->second) {
    // Record the dependency we just followed.
    if (this->CurrentEntry) {
      this->CurrentEntry->Depends.push_back(sf);
    }
    this->QueueSource(sf);
  }
}